

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnectionTestCase.cpp
# Opt level: O0

void CATCH2_INTERNAL_TEST_0(void)

{
  bool bVar1;
  StringRef SVar2;
  Decomposer local_3a0a;
  ExprLhs<bool> local_3a09;
  StringRef local_3a08;
  SourceLineInfo local_39f8;
  StringRef local_39e8;
  undefined1 local_39d8 [8];
  AssertionHandler catchAssertionHandler_79;
  UtcTimeStamp local_3978;
  UtcTimeOnly local_3960;
  UtcTimeOnly local_3948;
  Decomposer local_392a;
  ExprLhs<bool> local_3929;
  StringRef local_3928;
  SourceLineInfo local_3918;
  StringRef local_3908;
  undefined1 local_38f8 [8];
  AssertionHandler catchAssertionHandler_78;
  UtcTimeStamp local_3898;
  UtcTimeOnly local_3880;
  UtcTimeOnly local_3868;
  Decomposer local_384a;
  ExprLhs<bool> local_3849;
  StringRef local_3848;
  SourceLineInfo local_3838;
  StringRef local_3828;
  undefined1 local_3818 [8];
  AssertionHandler catchAssertionHandler_77;
  Decomposer local_37b2;
  ExprLhs<bool> local_37b1;
  StringRef local_37b0;
  SourceLineInfo local_37a0;
  StringRef local_3790;
  undefined1 local_3780 [8];
  AssertionHandler catchAssertionHandler_76;
  Decomposer local_371a;
  ExprLhs<bool> local_3719;
  StringRef local_3718;
  SourceLineInfo local_3708;
  StringRef local_36f8;
  undefined1 local_36e8 [8];
  AssertionHandler catchAssertionHandler_75;
  UtcTimeStamp local_3688;
  UtcTimeOnly local_3670;
  UtcTimeOnly local_3658;
  Decomposer local_363a;
  ExprLhs<bool> local_3639;
  StringRef local_3638;
  SourceLineInfo local_3628;
  StringRef local_3618;
  undefined1 local_3608 [8];
  AssertionHandler catchAssertionHandler_74;
  Decomposer local_35a2;
  ExprLhs<bool> local_35a1;
  StringRef local_35a0;
  SourceLineInfo local_3590;
  StringRef local_3580;
  undefined1 local_3570 [8];
  AssertionHandler catchAssertionHandler_73;
  Decomposer local_350a;
  ExprLhs<bool> local_3509;
  StringRef local_3508;
  SourceLineInfo local_34f8;
  StringRef local_34e8;
  undefined1 local_34d8 [8];
  AssertionHandler catchAssertionHandler_72;
  UtcTimeStamp local_3478;
  Decomposer local_345a;
  ExprLhs<bool> local_3459;
  StringRef local_3458;
  SourceLineInfo local_3448;
  StringRef local_3438;
  undefined1 local_3428 [8];
  AssertionHandler catchAssertionHandler_71;
  Decomposer local_33c2;
  ExprLhs<bool> local_33c1;
  StringRef local_33c0;
  SourceLineInfo local_33b0;
  StringRef local_33a0;
  undefined1 local_3390 [8];
  AssertionHandler catchAssertionHandler_70;
  Decomposer local_332a;
  ExprLhs<bool> local_3329;
  StringRef local_3328;
  SourceLineInfo local_3318;
  StringRef local_3308;
  undefined1 local_32f8 [8];
  AssertionHandler catchAssertionHandler_69;
  UtcTimeStamp local_3298;
  UtcTimeOnly local_3280;
  UtcTimeOnly local_3268;
  Decomposer local_324a;
  ExprLhs<bool> local_3249;
  StringRef local_3248;
  SourceLineInfo local_3238;
  StringRef local_3228;
  undefined1 local_3218 [8];
  AssertionHandler catchAssertionHandler_68;
  UtcTimeStamp local_31b8;
  UtcTimeOnly local_31a0;
  UtcTimeOnly local_3188;
  Decomposer local_316a;
  ExprLhs<bool> local_3169;
  StringRef local_3168;
  SourceLineInfo local_3158;
  StringRef local_3148;
  undefined1 local_3138 [8];
  AssertionHandler catchAssertionHandler_67;
  UtcTimeStamp local_30d8;
  UtcTimeOnly local_30c0;
  UtcTimeOnly local_30a8;
  Decomposer local_308a;
  ExprLhs<bool> local_3089;
  StringRef local_3088;
  SourceLineInfo local_3078;
  StringRef local_3068;
  undefined1 local_3058 [8];
  AssertionHandler catchAssertionHandler_66;
  SourceLineInfo local_2ff8;
  StringRef local_2fe8;
  undefined1 local_2fd8 [8];
  AssertionHandler catchAssertionHandler_65;
  UtcTimeStamp local_2f78;
  Decomposer local_2f5a;
  ExprLhs<bool> local_2f59;
  StringRef local_2f58;
  SourceLineInfo local_2f48;
  StringRef local_2f38;
  undefined1 local_2f28 [8];
  AssertionHandler catchAssertionHandler_64;
  UtcTimeStamp local_2ec8;
  Decomposer local_2eaa;
  ExprLhs<bool> local_2ea9;
  StringRef local_2ea8;
  SourceLineInfo local_2e98;
  StringRef local_2e88;
  undefined1 local_2e78 [8];
  AssertionHandler catchAssertionHandler_63;
  UtcTimeStamp local_2e18;
  UtcTimeOnly local_2e00;
  UtcTimeOnly local_2de8;
  Decomposer local_2dca;
  ExprLhs<bool> local_2dc9;
  StringRef local_2dc8;
  SourceLineInfo local_2db8;
  StringRef local_2da8;
  undefined1 local_2d98 [8];
  AssertionHandler catchAssertionHandler_62;
  UtcTimeStamp local_2d38;
  Decomposer local_2d1a;
  ExprLhs<bool> local_2d19;
  StringRef local_2d18;
  SourceLineInfo local_2d08;
  StringRef local_2cf8;
  undefined1 local_2ce8 [8];
  AssertionHandler catchAssertionHandler_61;
  UtcTimeStamp local_2c88;
  Decomposer local_2c6a;
  ExprLhs<bool> local_2c69;
  StringRef local_2c68;
  SourceLineInfo local_2c58;
  StringRef local_2c48;
  undefined1 local_2c38 [8];
  AssertionHandler catchAssertionHandler_60;
  UtcTimeStamp local_2bd8;
  Decomposer local_2bba;
  ExprLhs<bool> local_2bb9;
  StringRef local_2bb8;
  SourceLineInfo local_2ba8;
  StringRef local_2b98;
  undefined1 local_2b88 [8];
  AssertionHandler catchAssertionHandler_59;
  UtcTimeStamp local_2b28;
  Decomposer local_2b0a;
  ExprLhs<bool> local_2b09;
  StringRef local_2b08;
  SourceLineInfo local_2af8;
  StringRef local_2ae8;
  undefined1 local_2ad8 [8];
  AssertionHandler catchAssertionHandler_58;
  UtcTimeStamp local_2a78;
  Decomposer local_2a5a;
  ExprLhs<bool> local_2a59;
  StringRef local_2a58;
  SourceLineInfo local_2a48;
  StringRef local_2a38;
  undefined1 local_2a28 [8];
  AssertionHandler catchAssertionHandler_57;
  UtcTimeStamp local_29c8;
  Decomposer local_29aa;
  ExprLhs<bool> local_29a9;
  StringRef local_29a8;
  SourceLineInfo local_2998;
  StringRef local_2988;
  undefined1 local_2978 [8];
  AssertionHandler catchAssertionHandler_56;
  UtcTimeStamp local_2918;
  Decomposer local_28fa;
  ExprLhs<bool> local_28f9;
  StringRef local_28f8;
  SourceLineInfo local_28e8;
  StringRef local_28d8;
  undefined1 local_28c8 [8];
  AssertionHandler catchAssertionHandler_55;
  UtcTimeStamp time2_2;
  UtcTimeStamp time1_2;
  int endDay_3;
  int startDay_3;
  UtcTimeOnly endTime_3;
  UtcTimeOnly startTime_3;
  SourceLineInfo local_2808;
  Section local_27f8;
  Section *local_2798;
  Section *catch_internal_Section9;
  StringRef local_2788;
  SourceLineInfo local_2778;
  StringRef local_2768;
  undefined1 local_2758 [8];
  AssertionHandler catchAssertionHandler_54;
  TimeRange timeRange_2;
  undefined1 local_26d0 [8];
  UtcTimeStamp time2_1;
  UtcTimeStamp time1_1;
  LocalTimeOnly end_3;
  LocalTimeOnly start_3;
  SourceLineInfo local_2660;
  Section local_2650;
  Section *local_25f0;
  Section *catch_internal_Section8;
  StringRef local_25e0;
  SourceLineInfo local_25d0;
  StringRef local_25c0;
  undefined1 local_25b0 [8];
  AssertionHandler catchAssertionHandler_53;
  SourceLineInfo local_2550;
  StringRef local_2540;
  undefined1 local_2530 [8];
  AssertionHandler catchAssertionHandler_52;
  UtcTimeStamp local_24d0;
  UtcTimeOnly local_24b8;
  UtcTimeOnly local_24a0;
  Decomposer local_2482;
  ExprLhs<bool> local_2481;
  StringRef local_2480;
  SourceLineInfo local_2470;
  StringRef local_2460;
  undefined1 local_2450 [8];
  AssertionHandler catchAssertionHandler_51;
  SourceLineInfo local_23f0;
  StringRef local_23e0;
  undefined1 local_23d0 [8];
  AssertionHandler catchAssertionHandler_50;
  UtcTimeStamp local_2370;
  Decomposer local_2352;
  ExprLhs<bool> local_2351;
  StringRef local_2350;
  SourceLineInfo local_2340;
  StringRef local_2330;
  undefined1 local_2320 [8];
  AssertionHandler catchAssertionHandler_49;
  SourceLineInfo local_22c0;
  StringRef local_22b0;
  undefined1 local_22a0 [8];
  AssertionHandler catchAssertionHandler_48;
  UtcTimeStamp local_2240;
  Decomposer local_2222;
  ExprLhs<bool> local_2221;
  StringRef local_2220;
  SourceLineInfo local_2210;
  StringRef local_2200;
  undefined1 local_21f0 [8];
  AssertionHandler catchAssertionHandler_47;
  SourceLineInfo local_2190;
  StringRef local_2180;
  undefined1 local_2170 [8];
  AssertionHandler catchAssertionHandler_46;
  UtcTimeStamp local_2110;
  Decomposer local_20f2;
  ExprLhs<bool> local_20f1;
  StringRef local_20f0;
  SourceLineInfo local_20e0;
  StringRef local_20d0;
  undefined1 local_20c0 [8];
  AssertionHandler catchAssertionHandler_45;
  SourceLineInfo local_2060;
  StringRef local_2050;
  undefined1 local_2040 [8];
  AssertionHandler catchAssertionHandler_44;
  UtcTimeStamp local_1fe0;
  UtcTimeOnly local_1fc8;
  UtcTimeOnly local_1fb0;
  Decomposer local_1f92;
  ExprLhs<bool> local_1f91;
  StringRef local_1f90;
  SourceLineInfo local_1f80;
  StringRef local_1f70;
  undefined1 local_1f60 [8];
  AssertionHandler catchAssertionHandler_43;
  SourceLineInfo local_1f00;
  StringRef local_1ef0;
  undefined1 local_1ee0 [8];
  AssertionHandler catchAssertionHandler_42;
  UtcTimeStamp local_1e80;
  Decomposer local_1e62;
  ExprLhs<bool> local_1e61;
  StringRef local_1e60;
  SourceLineInfo local_1e50;
  StringRef local_1e40;
  undefined1 local_1e30 [8];
  AssertionHandler catchAssertionHandler_41;
  SourceLineInfo local_1dd0;
  StringRef local_1dc0;
  undefined1 local_1db0 [8];
  AssertionHandler catchAssertionHandler_40;
  UtcTimeStamp local_1d50;
  Decomposer local_1d32;
  ExprLhs<bool> local_1d31;
  StringRef local_1d30;
  SourceLineInfo local_1d20;
  StringRef local_1d10;
  undefined1 local_1d00 [8];
  AssertionHandler catchAssertionHandler_39;
  SourceLineInfo local_1ca0;
  StringRef local_1c90;
  undefined1 local_1c80 [8];
  AssertionHandler catchAssertionHandler_38;
  UtcTimeStamp local_1c20;
  Decomposer local_1c02;
  ExprLhs<bool> local_1c01;
  StringRef local_1c00;
  SourceLineInfo local_1bf0;
  StringRef local_1be0;
  undefined1 local_1bd0 [8];
  AssertionHandler catchAssertionHandler_37;
  SourceLineInfo local_1b70;
  StringRef local_1b60;
  undefined1 local_1b50 [8];
  AssertionHandler catchAssertionHandler_36;
  UtcTimeStamp local_1af0;
  Decomposer local_1ad2;
  ExprLhs<bool> local_1ad1;
  StringRef local_1ad0;
  SourceLineInfo local_1ac0;
  StringRef local_1ab0;
  undefined1 local_1aa0 [8];
  AssertionHandler catchAssertionHandler_35;
  SourceLineInfo local_1a40;
  StringRef local_1a30;
  undefined1 local_1a20 [8];
  AssertionHandler catchAssertionHandler_34;
  UtcTimeStamp time2;
  UtcTimeStamp time1;
  UtcTimeOnly end_2;
  UtcTimeOnly start_2;
  SourceLineInfo local_1968;
  Section local_1958;
  Section *local_18f8;
  Section *catch_internal_Section7;
  StringRef local_18e8;
  SourceLineInfo local_18d8;
  StringRef local_18c8;
  undefined1 local_18b8 [8];
  AssertionHandler catchAssertionHandler_33;
  UtcTimeStamp expPrevSession;
  SourceLineInfo local_1840;
  StringRef local_1830;
  undefined1 local_1820 [8];
  AssertionHandler catchAssertionHandler_32;
  UtcTimeStamp expNextSession;
  SourceLineInfo local_17a8;
  StringRef local_1798;
  undefined1 local_1788 [8];
  AssertionHandler catchAssertionHandler_31;
  UtcTimeStamp expSameSession2;
  SourceLineInfo local_1710;
  StringRef local_1700;
  undefined1 local_16f0 [8];
  AssertionHandler catchAssertionHandler_30;
  UtcTimeStamp expSameSession1;
  UtcTimeStamp creation;
  int endDay_2;
  int startDay_2;
  UtcTimeOnly endTime_2;
  UtcTimeOnly startTime_2;
  SourceLineInfo local_1630;
  Section local_1620;
  Section *local_15c0;
  Section *catch_internal_Section6;
  StringRef local_15b0;
  SourceLineInfo local_15a0;
  StringRef local_1590;
  undefined1 local_1580 [8];
  AssertionHandler catchAssertionHandler_29;
  TimeRange timeRange_1;
  undefined1 local_14f8 [8];
  UtcTimeStamp now_3;
  int endDay_1;
  int startDay_1;
  UtcTimeOnly endTime_1;
  UtcTimeOnly startTime_1;
  SourceLineInfo local_1498;
  Section local_1488;
  Section *local_1428;
  Section *catch_internal_Section5;
  StringRef local_1418;
  SourceLineInfo local_1408;
  StringRef local_13f8;
  undefined1 local_13e8 [8];
  AssertionHandler catchAssertionHandler_28;
  Decomposer local_1382;
  ExprLhs<bool> local_1381;
  StringRef local_1380;
  SourceLineInfo local_1370;
  StringRef local_1360;
  undefined1 local_1350 [8];
  AssertionHandler catchAssertionHandler_27;
  Decomposer local_12ea;
  ExprLhs<bool> local_12e9;
  StringRef local_12e8;
  SourceLineInfo local_12d8;
  StringRef local_12c8;
  undefined1 local_12b8 [8];
  AssertionHandler catchAssertionHandler_26;
  Decomposer local_1252;
  ExprLhs<bool> local_1251;
  StringRef local_1250;
  SourceLineInfo local_1240;
  StringRef local_1230;
  undefined1 local_1220 [8];
  AssertionHandler catchAssertionHandler_25;
  Decomposer local_11ba;
  ExprLhs<bool> local_11b9;
  StringRef local_11b8;
  SourceLineInfo local_11a8;
  StringRef local_1198;
  undefined1 local_1188 [8];
  AssertionHandler catchAssertionHandler_24;
  Decomposer local_1122;
  ExprLhs<bool> local_1121;
  StringRef local_1120;
  SourceLineInfo local_1110;
  StringRef local_1100;
  undefined1 local_10f0 [8];
  AssertionHandler catchAssertionHandler_23;
  Decomposer local_108a;
  ExprLhs<bool> local_1089;
  StringRef local_1088;
  SourceLineInfo local_1078;
  StringRef local_1068;
  undefined1 local_1058 [8];
  AssertionHandler catchAssertionHandler_22;
  Decomposer local_ff2;
  ExprLhs<bool> local_ff1;
  StringRef local_ff0;
  SourceLineInfo local_fe0;
  StringRef local_fd0;
  undefined1 local_fc0 [8];
  AssertionHandler catchAssertionHandler_21;
  UtcTimeOnly local_f60;
  UtcTimeOnly local_f48;
  Decomposer local_f2a;
  ExprLhs<bool> local_f29;
  StringRef local_f28;
  SourceLineInfo local_f18;
  StringRef local_f08;
  undefined1 local_ef8 [8];
  AssertionHandler catchAssertionHandler_20;
  Decomposer local_e92;
  ExprLhs<bool> local_e91;
  StringRef local_e90;
  SourceLineInfo local_e80;
  StringRef local_e70;
  undefined1 local_e60 [8];
  AssertionHandler catchAssertionHandler_19;
  Decomposer local_dfa;
  ExprLhs<bool> local_df9;
  StringRef local_df8;
  SourceLineInfo local_de8;
  StringRef local_dd8;
  undefined1 local_dc8 [8];
  AssertionHandler catchAssertionHandler_18;
  Decomposer local_d62;
  ExprLhs<bool> local_d61;
  StringRef local_d60;
  SourceLineInfo local_d50;
  StringRef local_d40;
  undefined1 local_d30 [8];
  AssertionHandler catchAssertionHandler_17;
  Decomposer local_cca;
  ExprLhs<bool> local_cc9;
  StringRef local_cc8;
  SourceLineInfo local_cb8;
  StringRef local_ca8;
  undefined1 local_c98 [8];
  AssertionHandler catchAssertionHandler_16;
  Decomposer local_c32;
  ExprLhs<bool> local_c31;
  StringRef local_c30;
  SourceLineInfo local_c20;
  StringRef local_c10;
  undefined1 local_c00 [8];
  AssertionHandler catchAssertionHandler_15;
  Decomposer local_b9a;
  ExprLhs<bool> local_b99;
  StringRef local_b98;
  SourceLineInfo local_b88;
  StringRef local_b78;
  undefined1 local_b68 [8];
  AssertionHandler catchAssertionHandler_14;
  Decomposer local_b02;
  ExprLhs<bool> local_b01;
  StringRef local_b00;
  SourceLineInfo local_af0;
  StringRef local_ae0;
  undefined1 local_ad0 [8];
  AssertionHandler catchAssertionHandler_13;
  Decomposer local_a6a;
  ExprLhs<bool> local_a69;
  StringRef local_a68;
  SourceLineInfo local_a58;
  StringRef local_a48;
  undefined1 local_a38 [8];
  AssertionHandler catchAssertionHandler_12;
  Decomposer local_9d2;
  ExprLhs<bool> local_9d1;
  StringRef local_9d0;
  SourceLineInfo local_9c0;
  StringRef local_9b0;
  undefined1 local_9a0 [8];
  AssertionHandler catchAssertionHandler_11;
  Decomposer local_93a;
  ExprLhs<bool> local_939;
  StringRef local_938;
  SourceLineInfo local_928;
  StringRef local_918;
  undefined1 local_908 [8];
  AssertionHandler catchAssertionHandler_10;
  UtcTimeStamp now_2;
  int endDay;
  int startDay;
  UtcTimeOnly endTime;
  UtcTimeOnly startTime;
  SourceLineInfo local_860;
  Section local_850;
  Section *local_7f0;
  Section *catch_internal_Section4;
  StringRef local_7e0;
  SourceLineInfo local_7d0;
  StringRef local_7c0;
  undefined1 local_7b0 [8];
  AssertionHandler catchAssertionHandler_9;
  TimeRange timeRange;
  undefined1 local_728 [8];
  UtcTimeStamp now_1;
  LocalTimeOnly end_1;
  LocalTimeOnly start_1;
  SourceLineInfo local_6d0;
  Section local_6c0;
  Section *local_660;
  Section *catch_internal_Section3;
  StringRef local_650;
  SourceLineInfo local_640;
  StringRef local_630;
  undefined1 local_620 [8];
  AssertionHandler catchAssertionHandler_8;
  Decomposer local_5ba;
  ExprLhs<bool> local_5b9;
  StringRef local_5b8;
  SourceLineInfo local_5a8;
  StringRef local_598;
  undefined1 local_588 [8];
  AssertionHandler catchAssertionHandler_7;
  Decomposer local_522;
  ExprLhs<bool> local_521;
  StringRef local_520;
  SourceLineInfo local_510;
  StringRef local_500;
  undefined1 local_4f0 [8];
  AssertionHandler catchAssertionHandler_6;
  Decomposer local_48a;
  ExprLhs<bool> local_489;
  StringRef local_488;
  SourceLineInfo local_478;
  StringRef local_468;
  undefined1 local_458 [8];
  AssertionHandler catchAssertionHandler_5;
  UtcTimeOnly local_3f8;
  UtcTimeOnly local_3e0;
  Decomposer local_3c2;
  ExprLhs<bool> local_3c1;
  StringRef local_3c0;
  SourceLineInfo local_3b0;
  StringRef local_3a0;
  undefined1 local_390 [8];
  AssertionHandler catchAssertionHandler_4;
  Decomposer local_32a;
  ExprLhs<bool> local_329;
  StringRef local_328;
  SourceLineInfo local_318;
  StringRef local_308;
  undefined1 local_2f8 [8];
  AssertionHandler catchAssertionHandler_3;
  Decomposer local_292;
  ExprLhs<bool> local_291;
  StringRef local_290;
  SourceLineInfo local_280;
  StringRef local_270;
  undefined1 local_260 [8];
  AssertionHandler catchAssertionHandler_2;
  Decomposer local_1fa;
  ExprLhs<bool> local_1f9;
  StringRef local_1f8;
  SourceLineInfo local_1e8;
  StringRef local_1d8;
  undefined1 local_1c8 [8];
  AssertionHandler catchAssertionHandler_1;
  Decomposer local_162;
  ExprLhs<bool> local_161;
  StringRef local_160;
  SourceLineInfo local_150;
  StringRef local_140;
  undefined1 local_130 [8];
  AssertionHandler catchAssertionHandler;
  UtcTimeStamp now;
  UtcTimeOnly end;
  UtcTimeOnly start;
  StringRef local_90;
  SourceLineInfo local_80;
  Section local_70;
  Section *local_10;
  Section *catch_internal_Section2;
  
  Catch::SourceLineInfo::SourceLineInfo
            (&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
             ,0x23);
  Catch::StringRef::StringRef(&local_90,"isInRange");
  Catch::Section::Section(&local_70,&local_80,local_90,(char *)0x0);
  local_10 = &local_70;
  bVar1 = Catch::Section::operator_cast_to_bool(&local_70);
  if (bVar1) {
    FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&end.super_DateTime.m_time,3,0,0,0);
    FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&now.super_DateTime.m_time,0x12,0,0,0);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler.m_resultCapture,10,0,0,10,10,2000);
    local_140 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_150,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x28);
    local_160 = operator____catch_sr("TimeRange::isInRange(start, end, now)",0x25);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_130,local_140,&local_150,local_160,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&end.super_DateTime.m_time,
                       (UtcTimeOnly *)&now.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler.m_resultCapture);
    local_161 = Catch::operator<=<bool,_0>(&local_162,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_130,&local_161);
    Catch::AssertionHandler::complete((AssertionHandler *)local_130);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_130);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_1.m_resultCapture,0x12,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_1.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_1.m_resultCapture);
    local_1d8 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x2b);
    local_1f8 = operator____catch_sr("TimeRange::isInRange(start, end, now)",0x25);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1c8,local_1d8,&local_1e8,local_1f8,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&end.super_DateTime.m_time,
                       (UtcTimeOnly *)&now.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler.m_resultCapture);
    local_1f9 = Catch::operator<=<bool,_0>(&local_1fa,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_1c8,&local_1f9);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1c8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1c8);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_2.m_resultCapture,2,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_2.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_2.m_resultCapture);
    local_270 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x2e);
    local_290 = operator____catch_sr("!TimeRange::isInRange(start, end, now)",0x26);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_260,local_270,&local_280,local_290,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&end.super_DateTime.m_time,
                       (UtcTimeOnly *)&now.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler.m_resultCapture);
    local_291 = Catch::operator<=<bool,_0>(&local_292,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_260,&local_291);
    Catch::AssertionHandler::complete((AssertionHandler *)local_260);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_260);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_3.m_resultCapture,0x13,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_3.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_3.m_resultCapture);
    local_308 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_318,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x31);
    local_328 = operator____catch_sr("!TimeRange::isInRange(start, end, now)",0x26);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2f8,local_308,&local_318,local_328,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&end.super_DateTime.m_time,
                       (UtcTimeOnly *)&now.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler.m_resultCapture);
    local_329 = Catch::operator<=<bool,_0>(&local_32a,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_2f8,&local_329);
    Catch::AssertionHandler::complete((AssertionHandler *)local_2f8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2f8);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_4.m_resultCapture,0x12,0,1,10,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_4.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_4.m_resultCapture);
    local_3a0 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x34);
    local_3c0 = operator____catch_sr("!TimeRange::isInRange(start, end, now)",0x26);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_390,local_3a0,&local_3b0,local_3c0,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&end.super_DateTime.m_time,
                       (UtcTimeOnly *)&now.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler.m_resultCapture);
    local_3c1 = Catch::operator<=<bool,_0>(&local_3c2,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_390,&local_3c1);
    Catch::AssertionHandler::complete((AssertionHandler *)local_390);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_390);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_3e0,0x12,0,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&end.super_DateTime.m_time,&local_3e0);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_3e0);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_3f8,3,0,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&now.super_DateTime.m_time,&local_3f8);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_3f8);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_5.m_resultCapture,0x12,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_5.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_5.m_resultCapture);
    local_468 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_478,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x39);
    local_488 = operator____catch_sr("TimeRange::isInRange(start, end, now)",0x25);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_458,local_468,&local_478,local_488,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&end.super_DateTime.m_time,
                       (UtcTimeOnly *)&now.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler.m_resultCapture);
    local_489 = Catch::operator<=<bool,_0>(&local_48a,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_458,&local_489);
    Catch::AssertionHandler::complete((AssertionHandler *)local_458);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_458);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_6.m_resultCapture,3,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_6.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_6.m_resultCapture);
    local_500 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_510,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x3c);
    local_520 = operator____catch_sr("TimeRange::isInRange(start, end, now)",0x25);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_4f0,local_500,&local_510,local_520,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&end.super_DateTime.m_time,
                       (UtcTimeOnly *)&now.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler.m_resultCapture);
    local_521 = Catch::operator<=<bool,_0>(&local_522,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_4f0,&local_521);
    Catch::AssertionHandler::complete((AssertionHandler *)local_4f0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_4f0);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_7.m_resultCapture,4,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_7.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_7.m_resultCapture);
    local_598 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_5a8,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x3f);
    local_5b8 = operator____catch_sr("!TimeRange::isInRange(start, end, now)",0x26);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_588,local_598,&local_5a8,local_5b8,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&end.super_DateTime.m_time,
                       (UtcTimeOnly *)&now.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler.m_resultCapture);
    local_5b9 = Catch::operator<=<bool,_0>(&local_5ba,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_588,&local_5b9);
    Catch::AssertionHandler::complete((AssertionHandler *)local_588);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_588);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_8.m_resultCapture,0x11,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_8.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_8.m_resultCapture);
    local_630 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_640,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x42);
    local_650 = operator____catch_sr("!TimeRange::isInRange(start, end, now)",0x26);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_620,local_630,&local_640,local_650,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&end.super_DateTime.m_time,
                       (UtcTimeOnly *)&now.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler.m_resultCapture);
    catch_internal_Section3._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&catch_internal_Section3 + 6),(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_620,(ExprLhs<bool> *)((long)&catch_internal_Section3 + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_620);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_620);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler.m_resultCapture);
    FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&now.super_DateTime.m_time);
    FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&end.super_DateTime.m_time);
  }
  Catch::Section::~Section(&local_70);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_6d0,
             "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
             ,0x45);
  Catch::StringRef::StringRef((StringRef *)&start_1.super_DateTime.m_time,"isInRange_UseLocalTime");
  Catch::Section::Section(&local_6c0,&local_6d0,stack0xfffffffffffff920,(char *)0x0);
  local_660 = &local_6c0;
  bVar1 = Catch::Section::operator_cast_to_bool(&local_6c0);
  if (bVar1) {
    FIX::LocalTimeOnly::LocalTimeOnly((LocalTimeOnly *)&end_1.super_DateTime.m_time,0,0,0,0);
    FIX::LocalTimeOnly::LocalTimeOnly((LocalTimeOnly *)&now_1.super_DateTime.m_time,1,0,0,0);
    FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_728,10,0,0,10,10,2000);
    FIX::TimeRange::TimeRange
              ((TimeRange *)&catchAssertionHandler_9.m_resultCapture,
               (LocalTimeOnly *)&end_1.super_DateTime.m_time,
               (LocalTimeOnly *)&now_1.super_DateTime.m_time,1,1);
    local_7c0 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_7d0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x4b);
    local_7e0 = operator____catch_sr("timeRange.isInRange(now)",0x18);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_7b0,local_7c0,&local_7d0,local_7e0,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((TimeRange *)&catchAssertionHandler_9.m_resultCapture,
                       (UtcTimeStamp *)local_728);
    catch_internal_Section4._7_1_ =
         Catch::operator<=<bool,_0>((Decomposer *)((long)&catch_internal_Section4 + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_7b0,(ExprLhs<bool> *)((long)&catch_internal_Section4 + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_7b0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_7b0);
    FIX::TimeRange::~TimeRange((TimeRange *)&catchAssertionHandler_9.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_728);
    FIX::LocalTimeOnly::~LocalTimeOnly((LocalTimeOnly *)&now_1.super_DateTime.m_time);
    FIX::LocalTimeOnly::~LocalTimeOnly((LocalTimeOnly *)&end_1.super_DateTime.m_time);
  }
  Catch::Section::~Section(&local_6c0);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_860,
             "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
             ,0x4e);
  Catch::StringRef::StringRef((StringRef *)&startTime.super_DateTime.m_time,"isInRangeWithDay");
  Catch::Section::Section(&local_850,&local_860,stack0xfffffffffffff790,(char *)0x0);
  local_7f0 = &local_850;
  bVar1 = Catch::Section::operator_cast_to_bool(&local_850);
  if (bVar1) {
    FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&endTime.super_DateTime.m_time,3,0,0,0);
    FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&endDay,0x12,0,0,0);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,2,0,0,0x1c,7,0x7d4);
    local_918 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_928,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x55);
    local_938 = operator____catch_sr
                          ("TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x3f);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_908,local_918,&local_928,local_938,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,2,5,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_939 = Catch::operator<=<bool,_0>(&local_93a,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_908,&local_939);
    Catch::AssertionHandler::complete((AssertionHandler *)local_908);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_908);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_11.m_resultCapture,0x12,0,0,0x1b,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_11.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_11.m_resultCapture);
    local_9b0 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_9c0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x57);
    local_9d0 = operator____catch_sr
                          ("TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x3f);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_9a0,local_9b0,&local_9c0,local_9d0,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,2,5,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_9d1 = Catch::operator<=<bool,_0>(&local_9d2,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_9a0,&local_9d1);
    Catch::AssertionHandler::complete((AssertionHandler *)local_9a0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_9a0);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_12.m_resultCapture,3,0,0,0x1b,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_12.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_12.m_resultCapture);
    local_a48 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_a58,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x59);
    local_a68 = operator____catch_sr
                          ("TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x3f);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_a38,local_a48,&local_a58,local_a68,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,2,5,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_a69 = Catch::operator<=<bool,_0>(&local_a6a,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_a38,&local_a69);
    Catch::AssertionHandler::complete((AssertionHandler *)local_a38);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_a38);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_13.m_resultCapture,2,0x3b,0x3b,0x1a,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_13.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_13.m_resultCapture);
    local_ae0 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_af0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x5b);
    local_b00 = operator____catch_sr
                          ("!TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x40);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_ad0,local_ae0,&local_af0,local_b00,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,2,5,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_b01 = Catch::operator<=<bool,_0>(&local_b02,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_ad0,&local_b01);
    Catch::AssertionHandler::complete((AssertionHandler *)local_ad0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_ad0);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_14.m_resultCapture,0x12,0,1,0x1d,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_14.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_14.m_resultCapture);
    local_b78 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_b88,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x5d);
    local_b98 = operator____catch_sr
                          ("!TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x40);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_b68,local_b78,&local_b88,local_b98,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,2,5,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_b99 = Catch::operator<=<bool,_0>(&local_b9a,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_b68,&local_b99);
    Catch::AssertionHandler::complete((AssertionHandler *)local_b68);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_b68);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_15.m_resultCapture,2,0,0,0x18,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_15.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_15.m_resultCapture);
    local_c10 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_c20,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,99);
    local_c30 = operator____catch_sr
                          ("TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x3f);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_c00,local_c10,&local_c20,local_c30,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,5,2,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_c31 = Catch::operator<=<bool,_0>(&local_c32,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_c00,&local_c31);
    Catch::AssertionHandler::complete((AssertionHandler *)local_c00);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_c00);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_16.m_resultCapture,2,0,0,0x1c,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_16.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_16.m_resultCapture);
    local_ca8 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_cb8,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x65);
    local_cc8 = operator____catch_sr
                          ("!TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x40);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_c98,local_ca8,&local_cb8,local_cc8,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,5,2,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_cc9 = Catch::operator<=<bool,_0>(&local_cca,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_c98,&local_cc9);
    Catch::AssertionHandler::complete((AssertionHandler *)local_c98);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_c98);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_17.m_resultCapture,3,0,0,0x16,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_17.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_17.m_resultCapture);
    local_d40 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_d50,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x67);
    local_d60 = operator____catch_sr
                          ("TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x3f);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_d30,local_d40,&local_d50,local_d60,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,5,2,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_d61 = Catch::operator<=<bool,_0>(&local_d62,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_d30,&local_d61);
    Catch::AssertionHandler::complete((AssertionHandler *)local_d30);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_d30);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_18.m_resultCapture,0x12,0,0,0x1a,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_18.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_18.m_resultCapture);
    local_dd8 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_de8,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x69);
    local_df8 = operator____catch_sr
                          ("TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x3f);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_dc8,local_dd8,&local_de8,local_df8,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,5,2,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_df9 = Catch::operator<=<bool,_0>(&local_dfa,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_dc8,&local_df9);
    Catch::AssertionHandler::complete((AssertionHandler *)local_dc8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_dc8);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_19.m_resultCapture,2,0x3b,0x3b,0x16,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_19.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_19.m_resultCapture);
    local_e70 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_e80,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x6b);
    local_e90 = operator____catch_sr
                          ("!TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x40);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_e60,local_e70,&local_e80,local_e90,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,5,2,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_e91 = Catch::operator<=<bool,_0>(&local_e92,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_e60,&local_e91);
    Catch::AssertionHandler::complete((AssertionHandler *)local_e60);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_e60);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_20.m_resultCapture,0x12,0,1,0x1a,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_20.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_20.m_resultCapture);
    local_f08 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_f18,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x6d);
    local_f28 = operator____catch_sr
                          ("!TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x40);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_ef8,local_f08,&local_f18,local_f28,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,5,2,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_f29 = Catch::operator<=<bool,_0>(&local_f2a,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_ef8,&local_f29);
    Catch::AssertionHandler::complete((AssertionHandler *)local_ef8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_ef8);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_f48,9,1,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endTime.super_DateTime.m_time,&local_f48);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_f48);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_f60,8,0x3b,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endDay,&local_f60);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_f60);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_21.m_resultCapture,8,0x3b,0,3,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_21.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_21.m_resultCapture);
    local_fd0 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_fe0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x75);
    local_ff0 = operator____catch_sr
                          ("TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x3f);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_fc0,local_fd0,&local_fe0,local_ff0,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,1,1,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_ff1 = Catch::operator<=<bool,_0>(&local_ff2,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_fc0,&local_ff1);
    Catch::AssertionHandler::complete((AssertionHandler *)local_fc0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_fc0);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_22.m_resultCapture,8,0x3b,1,3,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_22.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_22.m_resultCapture);
    local_1068 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1078,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x77);
    local_1088 = operator____catch_sr
                           ("!TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x40)
    ;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1058,local_1068,&local_1078,local_1088,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,1,1,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_1089 = Catch::operator<=<bool,_0>(&local_108a,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_1058,&local_1089);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1058);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1058);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_23.m_resultCapture,9,1,0,3,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_23.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_23.m_resultCapture);
    local_1100 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1110,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x79);
    local_1120 = operator____catch_sr
                           ("TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x3f);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_10f0,local_1100,&local_1110,local_1120,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,1,1,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_1121 = Catch::operator<=<bool,_0>(&local_1122,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_10f0,&local_1121);
    Catch::AssertionHandler::complete((AssertionHandler *)local_10f0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_10f0);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_24.m_resultCapture,9,0,0,3,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_24.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_24.m_resultCapture);
    local_1198 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_11a8,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x7b);
    local_11b8 = operator____catch_sr
                           ("!TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x40)
    ;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1188,local_1198,&local_11a8,local_11b8,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,1,1,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_11b9 = Catch::operator<=<bool,_0>(&local_11ba,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_1188,&local_11b9);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1188);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1188);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_25.m_resultCapture,8,0x3b,0,4,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_25.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_25.m_resultCapture);
    local_1230 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1240,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x7e);
    local_1250 = operator____catch_sr
                           ("TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x3f);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1220,local_1230,&local_1240,local_1250,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,1,1,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_1251 = Catch::operator<=<bool,_0>(&local_1252,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_1220,&local_1251);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1220);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1220);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_26.m_resultCapture,8,0x3b,1,4,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_26.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_26.m_resultCapture);
    local_12c8 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_12d8,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x80);
    local_12e8 = operator____catch_sr
                           ("TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x3f);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_12b8,local_12c8,&local_12d8,local_12e8,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,1,1,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_12e9 = Catch::operator<=<bool,_0>(&local_12ea,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_12b8,&local_12e9);
    Catch::AssertionHandler::complete((AssertionHandler *)local_12b8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_12b8);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_27.m_resultCapture,9,1,0,4,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_27.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_27.m_resultCapture);
    local_1360 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1370,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x82);
    local_1380 = operator____catch_sr
                           ("TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x3f);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1350,local_1360,&local_1370,local_1380,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,1,1,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    local_1381 = Catch::operator<=<bool,_0>(&local_1382,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_1350,&local_1381);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1350);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1350);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_28.m_resultCapture,9,0,0,4,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_28.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_28.m_resultCapture);
    local_13f8 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1408,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x84);
    local_1418 = operator____catch_sr
                           ("TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x3f);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_13e8,local_13f8,&local_1408,local_1418,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)&endDay,1,1,
                       (DateTime *)&catchAssertionHandler_10.m_resultCapture);
    catch_internal_Section5._7_1_ =
         Catch::operator<=<bool,_0>((Decomposer *)((long)&catch_internal_Section5 + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_13e8,(ExprLhs<bool> *)((long)&catch_internal_Section5 + 7))
    ;
    Catch::AssertionHandler::complete((AssertionHandler *)local_13e8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_13e8);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_10.m_resultCapture);
    FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&endDay);
    FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&endTime.super_DateTime.m_time);
  }
  Catch::Section::~Section(&local_850);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1498,
             "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
             ,0x87);
  Catch::StringRef::StringRef
            ((StringRef *)&startTime_1.super_DateTime.m_time,"isInRangeWithDay_SameDay");
  Catch::Section::Section(&local_1488,&local_1498,stack0xffffffffffffeb58,(char *)0x0);
  local_1428 = &local_1488;
  bVar1 = Catch::Section::operator_cast_to_bool(&local_1488);
  if (bVar1) {
    FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&endTime_1.super_DateTime.m_time,3,0,0,0);
    FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&endDay_1,0x12,0,0,0);
    now_3.super_DateTime.m_time._4_4_ = 2;
    now_3.super_DateTime.m_time._0_4_ = 2;
    FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_14f8,2,0,0,0x1c,7,0x7d4);
    FIX::TimeRange::TimeRange
              ((TimeRange *)&catchAssertionHandler_29.m_resultCapture,
               (UtcTimeOnly *)&endTime_1.super_DateTime.m_time,(UtcTimeOnly *)&endDay_1,
               now_3.super_DateTime.m_time._4_4_,(int)now_3.super_DateTime.m_time);
    local_1590 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_15a0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x8f);
    local_15b0 = operator____catch_sr
                           ("TimeRange::isInRange(startTime, endTime, startDay, endDay, now)",0x3f);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1580,local_1590,&local_15a0,local_15b0,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInRange
                      ((UtcTimeOnly *)&endTime_1.super_DateTime.m_time,(UtcTimeOnly *)&endDay_1,
                       now_3.super_DateTime.m_time._4_4_,(int)now_3.super_DateTime.m_time,
                       (DateTime *)local_14f8);
    catch_internal_Section6._7_1_ =
         Catch::operator<=<bool,_0>((Decomposer *)((long)&catch_internal_Section6 + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_1580,(ExprLhs<bool> *)((long)&catch_internal_Section6 + 7))
    ;
    Catch::AssertionHandler::complete((AssertionHandler *)local_1580);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1580);
    FIX::TimeRange::~TimeRange((TimeRange *)&catchAssertionHandler_29.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_14f8);
    FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&endDay_1);
    FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&endTime_1.super_DateTime.m_time);
  }
  Catch::Section::~Section(&local_1488);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1630,
             "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
             ,0x92);
  Catch::StringRef::StringRef
            ((StringRef *)&startTime_2.super_DateTime.m_time,
             "isInRangeWithDay_PastSundayOverlapSession");
  Catch::Section::Section(&local_1620,&local_1630,stack0xffffffffffffe9c0,(char *)0x0);
  local_15c0 = &local_1620;
  bVar1 = Catch::Section::operator_cast_to_bool(&local_1620);
  if (bVar1) {
    FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&endTime_2.super_DateTime.m_time,0,0,0,0);
    FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&endDay_2,0x17,0x3b,0x3b,0);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&expSameSession1.super_DateTime.m_time,0,0,1,0x17,4,0x7e5);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_30.m_resultCapture,8,0x1e,0,0x18,4,0x7e5);
    local_1700 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1710,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x9c);
    SVar2 = operator____catch_sr
                      ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expSameSession1)"
                       ,0x59);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_16f0,local_1700,&local_1710,SVar2,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_2.super_DateTime.m_time,(UtcTimeOnly *)&endDay_2,6,5,
                       (DateTime *)&expSameSession1.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_30.m_resultCapture);
    expSameSession2.super_DateTime.m_time._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&expSameSession2.super_DateTime.m_time + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_16f0,
               (ExprLhs<bool> *)((long)&expSameSession2.super_DateTime.m_time + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_16f0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_16f0);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_31.m_resultCapture,8,0x1e,0,0x1a,4,0x7e5);
    local_1798 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_17a8,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xa0);
    SVar2 = operator____catch_sr
                      ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expSameSession2)"
                       ,0x59);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1788,local_1798,&local_17a8,SVar2,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_2.super_DateTime.m_time,(UtcTimeOnly *)&endDay_2,6,5,
                       (DateTime *)&expSameSession1.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_31.m_resultCapture);
    expNextSession.super_DateTime.m_time._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&expNextSession.super_DateTime.m_time + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_1788,
               (ExprLhs<bool> *)((long)&expNextSession.super_DateTime.m_time + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_1788);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1788);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_32.m_resultCapture,8,0x1e,0,0x1e,4,0x7e5);
    local_1830 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1840,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xa4);
    SVar2 = operator____catch_sr
                      ("!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expNextSession)"
                       ,0x59);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1820,local_1830,&local_1840,SVar2,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_2.super_DateTime.m_time,(UtcTimeOnly *)&endDay_2,6,5,
                       (DateTime *)&expSameSession1.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_32.m_resultCapture);
    expPrevSession.super_DateTime.m_time._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&expPrevSession.super_DateTime.m_time + 6),
                    (bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_1820,
               (ExprLhs<bool> *)((long)&expPrevSession.super_DateTime.m_time + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_1820);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1820);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_33.m_resultCapture,0x17,0x3b,0x3a,0x16,4,0x7e5
              );
    local_18c8 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_18d8,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xa8);
    local_18e8 = operator____catch_sr
                           ("!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expPrevSession)"
                            ,0x59);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_18b8,local_18c8,&local_18d8,local_18e8,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_2.super_DateTime.m_time,(UtcTimeOnly *)&endDay_2,6,5,
                       (DateTime *)&expSameSession1.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_33.m_resultCapture);
    catch_internal_Section7._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&catch_internal_Section7 + 6),(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_18b8,(ExprLhs<bool> *)((long)&catch_internal_Section7 + 7))
    ;
    Catch::AssertionHandler::complete((AssertionHandler *)local_18b8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_18b8);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_33.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_32.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_31.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_30.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&expSameSession1.super_DateTime.m_time);
    FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&endDay_2);
    FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&endTime_2.super_DateTime.m_time);
  }
  Catch::Section::~Section(&local_1620);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1968,
             "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
             ,0xab);
  Catch::StringRef::StringRef((StringRef *)&start_2.super_DateTime.m_time,"isInSameRange");
  Catch::Section::Section(&local_1958,&local_1968,stack0xffffffffffffe688,(char *)0x0);
  local_18f8 = &local_1958;
  bVar1 = Catch::Section::operator_cast_to_bool(&local_1958);
  if (bVar1) {
    FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&end_2.super_DateTime.m_time,3,0,0,0);
    FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&time1.super_DateTime.m_time,0x12,0,0,0);
    FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&time2.super_DateTime.m_time,10,0,0,10,10,2000);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_34.m_resultCapture,10,0,0,10,10,2000);
    local_1a30 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1a40,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xb3);
    SVar2 = operator____catch_sr("TimeRange::isInSameRange(start, end, time1, time2)",0x32);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1a20,local_1a30,&local_1a40,SVar2,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&time2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture);
    catchAssertionHandler_35.m_resultCapture._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&catchAssertionHandler_35.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_1a20,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_35.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_1a20);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1a20);
    local_1ab0 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1ac0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xb4);
    local_1ad0 = operator____catch_sr("TimeRange::isInSameRange(start, end, time2, time1)",0x32);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1aa0,local_1ab0,&local_1ac0,local_1ad0,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture,
                       (DateTime *)&time2.super_DateTime.m_time);
    local_1ad1 = Catch::operator<=<bool,_0>(&local_1ad2,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_1aa0,&local_1ad1);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1aa0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1aa0);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_1af0,10,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_1af0);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_1af0);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_36.m_resultCapture,0xb,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_34.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_36.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_36.m_resultCapture);
    local_1b60 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1b70,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xb9);
    SVar2 = operator____catch_sr("TimeRange::isInSameRange(start, end, time1, time2)",0x32);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1b50,local_1b60,&local_1b70,SVar2,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&time2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture);
    catchAssertionHandler_37.m_resultCapture._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&catchAssertionHandler_37.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_1b50,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_37.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_1b50);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1b50);
    local_1be0 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1bf0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xba);
    local_1c00 = operator____catch_sr("TimeRange::isInSameRange(start, end, time2, time1)",0x32);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1bd0,local_1be0,&local_1bf0,local_1c00,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture,
                       (DateTime *)&time2.super_DateTime.m_time);
    local_1c01 = Catch::operator<=<bool,_0>(&local_1c02,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_1bd0,&local_1c01);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1bd0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1bd0);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_1c20,0xb,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_1c20);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_1c20);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_38.m_resultCapture,10,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_34.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_38.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_38.m_resultCapture);
    local_1c90 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1ca0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xbf);
    SVar2 = operator____catch_sr("TimeRange::isInSameRange(start, end, time1, time2)",0x32);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1c80,local_1c90,&local_1ca0,SVar2,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&time2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture);
    catchAssertionHandler_39.m_resultCapture._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&catchAssertionHandler_39.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_1c80,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_39.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_1c80);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1c80);
    local_1d10 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1d20,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xc0);
    local_1d30 = operator____catch_sr("TimeRange::isInSameRange(start, end, time2, time1)",0x32);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1d00,local_1d10,&local_1d20,local_1d30,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture,
                       (DateTime *)&time2.super_DateTime.m_time);
    local_1d31 = Catch::operator<=<bool,_0>(&local_1d32,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_1d00,&local_1d31);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1d00);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1d00);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_1d50,0x13,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_1d50);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_1d50);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_40.m_resultCapture,10,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_34.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_40.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_40.m_resultCapture);
    local_1dc0 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1dd0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xc5);
    SVar2 = operator____catch_sr("!TimeRange::isInSameRange(start, end, time1, time2)",0x33);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1db0,local_1dc0,&local_1dd0,SVar2,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&time2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture);
    catchAssertionHandler_41.m_resultCapture._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&catchAssertionHandler_41.m_resultCapture + 6),
                    (bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_1db0,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_41.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_1db0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1db0);
    local_1e40 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1e50,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xc6);
    local_1e60 = operator____catch_sr("!TimeRange::isInSameRange(start, end, time2, time1)",0x33);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1e30,local_1e40,&local_1e50,local_1e60,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture,
                       (DateTime *)&time2.super_DateTime.m_time);
    local_1e61 = Catch::operator<=<bool,_0>(&local_1e62,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_1e30,&local_1e61);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1e30);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1e30);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_1e80,10,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_1e80);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_1e80);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_42.m_resultCapture,2,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_34.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_42.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_42.m_resultCapture);
    local_1ef0 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1f00,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xcb);
    SVar2 = operator____catch_sr("!TimeRange::isInSameRange(start, end, time1, time2)",0x33);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1ee0,local_1ef0,&local_1f00,SVar2,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&time2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture);
    catchAssertionHandler_43.m_resultCapture._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&catchAssertionHandler_43.m_resultCapture + 6),
                    (bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_1ee0,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_43.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_1ee0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1ee0);
    local_1f70 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1f80,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xcc);
    local_1f90 = operator____catch_sr("!TimeRange::isInSameRange(start, end, time2, time1)",0x33);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1f60,local_1f70,&local_1f80,local_1f90,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture,
                       (DateTime *)&time2.super_DateTime.m_time);
    local_1f91 = Catch::operator<=<bool,_0>(&local_1f92,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_1f60,&local_1f91);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1f60);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1f60);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_1fb0,0x12,0,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&end_2.super_DateTime.m_time,&local_1fb0);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_1fb0);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_1fc8,3,0,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&time1.super_DateTime.m_time,&local_1fc8);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_1fc8);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_1fe0,0x13,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_1fe0);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_1fe0);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_44.m_resultCapture,0x14,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_34.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_44.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_44.m_resultCapture);
    local_2050 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2060,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xd5);
    SVar2 = operator____catch_sr("TimeRange::isInSameRange(start, end, time1, time2)",0x32);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2040,local_2050,&local_2060,SVar2,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&time2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture);
    catchAssertionHandler_45.m_resultCapture._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&catchAssertionHandler_45.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_2040,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_45.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_2040);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2040);
    local_20d0 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_20e0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xd6);
    local_20f0 = operator____catch_sr("TimeRange::isInSameRange(start, end, time2, time1)",0x32);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_20c0,local_20d0,&local_20e0,local_20f0,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture,
                       (DateTime *)&time2.super_DateTime.m_time);
    local_20f1 = Catch::operator<=<bool,_0>(&local_20f2,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_20c0,&local_20f1);
    Catch::AssertionHandler::complete((AssertionHandler *)local_20c0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_20c0);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_2110,0x13,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_2110);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_2110);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_46.m_resultCapture,2,0,0,0xb,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_34.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_46.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_46.m_resultCapture);
    local_2180 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2190,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xdb);
    SVar2 = operator____catch_sr("TimeRange::isInSameRange(start, end, time1, time2)",0x32);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2170,local_2180,&local_2190,SVar2,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&time2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture);
    catchAssertionHandler_47.m_resultCapture._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&catchAssertionHandler_47.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_2170,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_47.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_2170);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2170);
    local_2200 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2210,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xdc);
    local_2220 = operator____catch_sr("TimeRange::isInSameRange(start, end, time2, time1)",0x32);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_21f0,local_2200,&local_2210,local_2220,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture,
                       (DateTime *)&time2.super_DateTime.m_time);
    local_2221 = Catch::operator<=<bool,_0>(&local_2222,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_21f0,&local_2221);
    Catch::AssertionHandler::complete((AssertionHandler *)local_21f0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_21f0);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_2240,2,0,0,0xb,10,2000);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_2240);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_2240);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_48.m_resultCapture,0x13,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_34.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_48.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_48.m_resultCapture);
    local_22b0 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_22c0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xe1);
    SVar2 = operator____catch_sr("TimeRange::isInSameRange(start, end, time1, time2)",0x32);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_22a0,local_22b0,&local_22c0,SVar2,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&time2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture);
    catchAssertionHandler_49.m_resultCapture._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&catchAssertionHandler_49.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_22a0,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_49.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_22a0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_22a0);
    local_2330 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2340,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xe2);
    local_2350 = operator____catch_sr("TimeRange::isInSameRange(start, end, time2, time1)",0x32);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2320,local_2330,&local_2340,local_2350,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture,
                       (DateTime *)&time2.super_DateTime.m_time);
    local_2351 = Catch::operator<=<bool,_0>(&local_2352,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_2320,&local_2351);
    Catch::AssertionHandler::complete((AssertionHandler *)local_2320);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2320);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_2370,0x15,0,0,0xb,10,2000);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_2370);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_2370);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_50.m_resultCapture,0x14,0,0,10,10,2000);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_34.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_50.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_50.m_resultCapture);
    local_23e0 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_23f0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xe7);
    SVar2 = operator____catch_sr("!TimeRange::isInSameRange(start, end, time1, time2)",0x33);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_23d0,local_23e0,&local_23f0,SVar2,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&time2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture);
    catchAssertionHandler_51.m_resultCapture._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&catchAssertionHandler_51.m_resultCapture + 6),
                    (bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_23d0,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_51.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_23d0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_23d0);
    local_2460 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2470,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xe8);
    local_2480 = operator____catch_sr("!TimeRange::isInSameRange(start, end, time2, time1)",0x33);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2450,local_2460,&local_2470,local_2480,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture,
                       (DateTime *)&time2.super_DateTime.m_time);
    local_2481 = Catch::operator<=<bool,_0>(&local_2482,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_2450,&local_2481);
    Catch::AssertionHandler::complete((AssertionHandler *)local_2450);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2450);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_24a0,6,0,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&end_2.super_DateTime.m_time,&local_24a0);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_24a0);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_24b8,6,0,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&time1.super_DateTime.m_time,&local_24b8);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_24b8);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_24d0,0x13,10,0,1,0xd,0x7d4);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_24d0);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_24d0);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_52.m_resultCapture,0x13,6,0,1,0xe,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_34.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_52.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_52.m_resultCapture);
    local_2540 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2550,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xef);
    SVar2 = operator____catch_sr("!TimeRange::isInSameRange(start, end, time1, time2)",0x33);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2530,local_2540,&local_2550,SVar2,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&time2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture);
    catchAssertionHandler_53.m_resultCapture._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&catchAssertionHandler_53.m_resultCapture + 6),
                    (bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_2530,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_53.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_2530);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2530);
    local_25c0 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_25d0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xf0);
    local_25e0 = operator____catch_sr("!TimeRange::isInSameRange(start, end, time2, time1)",0x33);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_25b0,local_25c0,&local_25d0,local_25e0,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&end_2.super_DateTime.m_time,
                       (UtcTimeOnly *)&time1.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_34.m_resultCapture,
                       (DateTime *)&time2.super_DateTime.m_time);
    catch_internal_Section8._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&catch_internal_Section8 + 6),(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_25b0,(ExprLhs<bool> *)((long)&catch_internal_Section8 + 7))
    ;
    Catch::AssertionHandler::complete((AssertionHandler *)local_25b0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_25b0);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_34.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&time2.super_DateTime.m_time);
    FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&time1.super_DateTime.m_time);
    FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&end_2.super_DateTime.m_time);
  }
  Catch::Section::~Section(&local_1958);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2660,
             "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
             ,0xf3);
  Catch::StringRef::StringRef
            ((StringRef *)&start_3.super_DateTime.m_time,"isInSameRange_UseLocalTime");
  Catch::Section::Section(&local_2650,&local_2660,stack0xffffffffffffd990,(char *)0x0);
  local_25f0 = &local_2650;
  bVar1 = Catch::Section::operator_cast_to_bool(&local_2650);
  if (bVar1) {
    FIX::LocalTimeOnly::LocalTimeOnly((LocalTimeOnly *)&end_3.super_DateTime.m_time,0,0,0,0);
    FIX::LocalTimeOnly::LocalTimeOnly((LocalTimeOnly *)&time1_1.super_DateTime.m_time,1,0,0,0);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&time2_1.super_DateTime.m_time,10,0,0,10,10,2000);
    FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_26d0,0xb,0,0,10,10,2000);
    FIX::TimeRange::TimeRange
              ((TimeRange *)&catchAssertionHandler_54.m_resultCapture,
               (LocalTimeOnly *)&end_3.super_DateTime.m_time,
               (LocalTimeOnly *)&time1_1.super_DateTime.m_time,1,1);
    local_2768 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2778,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0xfb);
    local_2788 = operator____catch_sr("timeRange.isInSameRange(time1, time2)",0x25);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2758,local_2768,&local_2778,local_2788,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((TimeRange *)&catchAssertionHandler_54.m_resultCapture,
                       (UtcTimeStamp *)&time2_1.super_DateTime.m_time,(UtcTimeStamp *)local_26d0);
    catch_internal_Section9._7_1_ =
         Catch::operator<=<bool,_0>((Decomposer *)((long)&catch_internal_Section9 + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_2758,(ExprLhs<bool> *)((long)&catch_internal_Section9 + 7))
    ;
    Catch::AssertionHandler::complete((AssertionHandler *)local_2758);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2758);
    FIX::TimeRange::~TimeRange((TimeRange *)&catchAssertionHandler_54.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_26d0);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&time2_1.super_DateTime.m_time);
    FIX::LocalTimeOnly::~LocalTimeOnly((LocalTimeOnly *)&time1_1.super_DateTime.m_time);
    FIX::LocalTimeOnly::~LocalTimeOnly((LocalTimeOnly *)&end_3.super_DateTime.m_time);
  }
  Catch::Section::~Section(&local_2650);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2808,
             "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
             ,0xfe);
  Catch::StringRef::StringRef
            ((StringRef *)&startTime_3.super_DateTime.m_time,"isInSameRangeWithDay");
  Catch::Section::Section(&local_27f8,&local_2808,stack0xffffffffffffd7e8,(char *)0x0);
  local_2798 = &local_27f8;
  bVar1 = Catch::Section::operator_cast_to_bool(&local_27f8);
  if (bVar1) {
    FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,3,0,0,0);
    FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&endDay_3,0x12,0,0,0);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&time2_2.super_DateTime.m_time,3,0,0,0x1b,7,0x7d4);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,3,0,0,0x19,7,0x7d4);
    local_28d8 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_28e8,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x106);
    local_28f8 = operator____catch_sr
                           ("!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4d);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_28c8,local_28d8,&local_28e8,local_28f8,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,2,5,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_28f9 = Catch::operator<=<bool,_0>(&local_28fa,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_28c8,&local_28f9);
    Catch::AssertionHandler::complete((AssertionHandler *)local_28c8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_28c8);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_2918,3,0,0,0x1f,7,0x7d4);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_2918);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_2918);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_56.m_resultCapture,3,0,0,0x1b,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_56.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_56.m_resultCapture);
    local_2988 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2998,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x10a);
    local_29a8 = operator____catch_sr
                           ("!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4d);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2978,local_2988,&local_2998,local_29a8,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,2,5,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_29a9 = Catch::operator<=<bool,_0>(&local_29aa,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_2978,&local_29a9);
    Catch::AssertionHandler::complete((AssertionHandler *)local_2978);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2978);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_29c8,3,0,0,0x1b,7,0x7d4);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_29c8);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_29c8);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_57.m_resultCapture,3,0,0,0x1b,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_57.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_57.m_resultCapture);
    local_2a38 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2a48,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x10e);
    local_2a58 = operator____catch_sr
                           ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4c);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2a28,local_2a38,&local_2a48,local_2a58,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,2,5,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_2a59 = Catch::operator<=<bool,_0>(&local_2a5a,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_2a28,&local_2a59);
    Catch::AssertionHandler::complete((AssertionHandler *)local_2a28);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2a28);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_2a78,10,0,0,0x1a,7,0x7d4);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_2a78);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_2a78);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_58.m_resultCapture,3,0,0,0x1b,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_58.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_58.m_resultCapture);
    local_2ae8 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2af8,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x112);
    local_2b08 = operator____catch_sr
                           ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4c);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2ad8,local_2ae8,&local_2af8,local_2b08,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,2,5,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_2b09 = Catch::operator<=<bool,_0>(&local_2b0a,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_2ad8,&local_2b09);
    Catch::AssertionHandler::complete((AssertionHandler *)local_2ad8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2ad8);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_2b28,10,0,0,0x1b,7,0x7d4);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_2b28);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_2b28);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_59.m_resultCapture,2,0,0,0x1d,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_59.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_59.m_resultCapture);
    local_2b98 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2ba8,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x116);
    local_2bb8 = operator____catch_sr
                           ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4c);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2b88,local_2b98,&local_2ba8,local_2bb8,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,2,5,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_2bb9 = Catch::operator<=<bool,_0>(&local_2bba,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_2b88,&local_2bb9);
    Catch::AssertionHandler::complete((AssertionHandler *)local_2b88);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2b88);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_2bd8,10,0,0,0x1b,7,0x7d4);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_2bd8);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_2bd8);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_60.m_resultCapture,3,0,0,0x14,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_60.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_60.m_resultCapture);
    local_2c48 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2c58,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x11a);
    local_2c68 = operator____catch_sr
                           ("!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4d);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2c38,local_2c48,&local_2c58,local_2c68,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,2,5,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_2c69 = Catch::operator<=<bool,_0>(&local_2c6a,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_2c38,&local_2c69);
    Catch::AssertionHandler::complete((AssertionHandler *)local_2c38);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2c38);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_2c88,2,0,0,0x1b,7,0x7d4);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_2c88);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_2c88);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_61.m_resultCapture,3,0,0,0x14,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_61.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_61.m_resultCapture);
    local_2cf8 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2d08,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x11e);
    local_2d18 = operator____catch_sr
                           ("!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4d);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2ce8,local_2cf8,&local_2d08,local_2d18,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,2,5,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_2d19 = Catch::operator<=<bool,_0>(&local_2d1a,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_2ce8,&local_2d19);
    Catch::AssertionHandler::complete((AssertionHandler *)local_2ce8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2ce8);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_2d38,2,0,0,0x1a,7,0x7d4);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_2d38);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_2d38);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_62.m_resultCapture,3,0,0,0x13,7,0x7d4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_62.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_62.m_resultCapture);
    local_2da8 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2db8,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x122);
    local_2dc8 = operator____catch_sr
                           ("!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4d);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2d98,local_2da8,&local_2db8,local_2dc8,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,2,5,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_2dc9 = Catch::operator<=<bool,_0>(&local_2dca,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_2d98,&local_2dc9);
    Catch::AssertionHandler::complete((AssertionHandler *)local_2d98);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2d98);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_2de8,0,5,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,&local_2de8);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_2de8);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_2e00,0x17,0x2d,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endDay_3,&local_2e00);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_2e00);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_2e18,0,0,0,4,4,0x7d6);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_2e18);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_2e18);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_63.m_resultCapture,1,0,0,3,4,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_63.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_63.m_resultCapture);
    local_2e88 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2e98,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x12f);
    local_2ea8 = operator____catch_sr
                           ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4c);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2e78,local_2e88,&local_2e98,local_2ea8,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,1,7,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_2ea9 = Catch::operator<=<bool,_0>(&local_2eaa,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_2e78,&local_2ea9);
    Catch::AssertionHandler::complete((AssertionHandler *)local_2e78);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2e78);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_2ec8,0,0,0,0x1e,10,0x7d6);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_2ec8);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_2ec8);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_64.m_resultCapture,1,0,0,0x1f,10,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_64.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_64.m_resultCapture);
    local_2f38 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2f48,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x134);
    local_2f58 = operator____catch_sr
                           ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4c);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2f28,local_2f38,&local_2f48,local_2f58,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,1,7,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_2f59 = Catch::operator<=<bool,_0>(&local_2f5a,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_2f28,&local_2f59);
    Catch::AssertionHandler::complete((AssertionHandler *)local_2f28);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2f28);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_2f78,10,10,10,0x1f,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_2f78);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_2f78);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_65.m_resultCapture,10,10,10,1,1,0x7d7);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_65.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_65.m_resultCapture);
    local_2fe8 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2ff8,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x139);
    SVar2 = operator____catch_sr
                      ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                       ,0x4c);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2fd8,local_2fe8,&local_2ff8,SVar2,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,1,7,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    catchAssertionHandler_66.m_resultCapture._7_1_ =
         Catch::operator<=<bool,_0>
                   ((Decomposer *)((long)&catchAssertionHandler_66.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_2fd8,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_66.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_2fd8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2fd8);
    local_3068 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_3078,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x13e);
    local_3088 = operator____catch_sr
                           ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4c);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_3058,local_3068,&local_3078,local_3088,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,-1,
                       -1,(DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_3089 = Catch::operator<=<bool,_0>(&local_308a,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_3058,&local_3089);
    Catch::AssertionHandler::complete((AssertionHandler *)local_3058);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_3058);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_30a8,0x16,0x1c,0x14,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,&local_30a8);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_30a8);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_30c0,0x16,0x1c,5,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endDay_3,&local_30c0);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_30c0);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_30d8,0x16,0x1c,2,0x10,1,0x7e4);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_30d8);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_30d8);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_67.m_resultCapture,0x16,0x1e,0x2f,0x10,1,0x7e4
              );
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_67.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_67.m_resultCapture);
    local_3148 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_3158,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x146);
    local_3168 = operator____catch_sr
                           ("!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4d);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_3138,local_3148,&local_3158,local_3168,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,5,5,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_3169 = Catch::operator<=<bool,_0>(&local_316a,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_3138,&local_3169);
    Catch::AssertionHandler::complete((AssertionHandler *)local_3138);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_3138);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_3188,0x16,0x18,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,&local_3188);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_3188);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_31a0,0x16,0xf,0x1e,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endDay_3,&local_31a0);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_31a0);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_31b8,0x12,0xf,0xf,0xf,1,0x7e4);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_31b8);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_31b8);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_68.m_resultCapture,0x16,0x1a,0x14,0x10,1,0x7e4
              );
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_68.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_68.m_resultCapture);
    local_3228 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_3238,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x14c);
    local_3248 = operator____catch_sr
                           ("!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4d);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_3218,local_3228,&local_3238,local_3248,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,5,5,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_3249 = Catch::operator<=<bool,_0>(&local_324a,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_3218,&local_3249);
    Catch::AssertionHandler::complete((AssertionHandler *)local_3218);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_3218);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_3268,9,1,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,&local_3268);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_3268);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_3280,8,0x3b,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endDay_3,&local_3280);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_3280);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_3298,9,1,0,3,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_3298);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_3298);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_69.m_resultCapture,9,1,0,3,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_69.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_69.m_resultCapture);
    local_3308 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_3318,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x155);
    local_3328 = operator____catch_sr
                           ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4c);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_32f8,local_3308,&local_3318,local_3328,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,1,1,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_3329 = Catch::operator<=<bool,_0>(&local_332a,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_32f8,&local_3329);
    Catch::AssertionHandler::complete((AssertionHandler *)local_32f8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_32f8);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_70.m_resultCapture,9,1,0,10,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_70.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_70.m_resultCapture);
    local_33a0 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_33b0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x157);
    local_33c0 = operator____catch_sr
                           ("!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4d);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_3390,local_33a0,&local_33b0,local_33c0,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,1,1,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_33c1 = Catch::operator<=<bool,_0>(&local_33c2,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_3390,&local_33c1);
    Catch::AssertionHandler::complete((AssertionHandler *)local_3390);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_3390);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_71.m_resultCapture,9,1,0,4,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_71.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_71.m_resultCapture);
    local_3438 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_3448,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x159);
    local_3458 = operator____catch_sr
                           ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4c);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_3428,local_3438,&local_3448,local_3458,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,1,1,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_3459 = Catch::operator<=<bool,_0>(&local_345a,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_3428,&local_3459);
    Catch::AssertionHandler::complete((AssertionHandler *)local_3428);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_3428);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_3478,10,1,0,3,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_3478);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_3478);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_72.m_resultCapture,9,1,0,10,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_72.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_72.m_resultCapture);
    local_34e8 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_34f8,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x15d);
    local_3508 = operator____catch_sr
                           ("!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4d);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_34d8,local_34e8,&local_34f8,local_3508,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,1,1,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_3509 = Catch::operator<=<bool,_0>(&local_350a,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_34d8,&local_3509);
    Catch::AssertionHandler::complete((AssertionHandler *)local_34d8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_34d8);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_73.m_resultCapture,8,1,0,10,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_73.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_73.m_resultCapture);
    local_3580 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_3590,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x15f);
    local_35a0 = operator____catch_sr
                           ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4c);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_3570,local_3580,&local_3590,local_35a0,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,1,1,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_35a1 = Catch::operator<=<bool,_0>(&local_35a2,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_3570,&local_35a1);
    Catch::AssertionHandler::complete((AssertionHandler *)local_3570);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_3570);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_74.m_resultCapture,8,1,0,5,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_74.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_74.m_resultCapture);
    local_3618 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_3628,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x161);
    local_3638 = operator____catch_sr
                           ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4c);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_3608,local_3618,&local_3628,local_3638,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,1,1,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_3639 = Catch::operator<=<bool,_0>(&local_363a,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_3608,&local_3639);
    Catch::AssertionHandler::complete((AssertionHandler *)local_3608);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_3608);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_3658,9,1,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,&local_3658);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_3658);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_3670,8,0x3b,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endDay_3,&local_3670);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_3670);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_3688,9,1,0,3,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_3688);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_3688);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_75.m_resultCapture,9,1,0,5,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_75.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_75.m_resultCapture);
    local_36f8 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_3708,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x16a);
    local_3718 = operator____catch_sr
                           ("!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4d);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_36e8,local_36f8,&local_3708,local_3718,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,2,2,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_3719 = Catch::operator<=<bool,_0>(&local_371a,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_36e8,&local_3719);
    Catch::AssertionHandler::complete((AssertionHandler *)local_36e8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_36e8);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_76.m_resultCapture,9,1,0,0xb,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_76.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_76.m_resultCapture);
    local_3790 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_37a0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x16c);
    local_37b0 = operator____catch_sr
                           ("!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4d);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_3780,local_3790,&local_37a0,local_37b0,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,2,2,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_37b1 = Catch::operator<=<bool,_0>(&local_37b2,(bool)(~bVar1 & 1));
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_3780,&local_37b1);
    Catch::AssertionHandler::complete((AssertionHandler *)local_3780);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_3780);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_77.m_resultCapture,8,1,0,3,0xc,0x7d6);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_77.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_77.m_resultCapture);
    local_3828 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_3838,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x16e);
    local_3848 = operator____catch_sr
                           ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4c);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_3818,local_3828,&local_3838,local_3848,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,2,2,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_3849 = Catch::operator<=<bool,_0>(&local_384a,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_3818,&local_3849);
    Catch::AssertionHandler::complete((AssertionHandler *)local_3818);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_3818);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_3868,0x11,0,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,&local_3868);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_3868);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_3880,0x10,2,0x1e,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endDay_3,&local_3880);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_3880);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_3898,0x17,4,3,0x11,1,0x7e4);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_3898);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_3898);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_78.m_resultCapture,6,0,0,0x13,1,0x7e4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_78.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_78.m_resultCapture);
    local_3908 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_3918,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x177);
    local_3928 = operator____catch_sr
                           ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4c);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_38f8,local_3908,&local_3918,local_3928,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,2,2,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_3929 = Catch::operator<=<bool,_0>(&local_392a,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_38f8,&local_3929);
    Catch::AssertionHandler::complete((AssertionHandler *)local_38f8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_38f8);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_3948,0x11,0,0,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,&local_3948);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_3948);
    FIX::UtcTimeOnly::UtcTimeOnly(&local_3960,0x10,2,0x1e,0);
    FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endDay_3,&local_3960);
    FIX::UtcTimeOnly::~UtcTimeOnly(&local_3960);
    FIX::UtcTimeStamp::UtcTimeStamp(&local_3978,0x17,4,3,0x11,1,0x7e4);
    FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2_2.super_DateTime.m_time,&local_3978);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_3978);
    FIX::UtcTimeStamp::UtcTimeStamp
              ((UtcTimeStamp *)&catchAssertionHandler_79.m_resultCapture,6,0,0,0x14,1,0x7e4);
    FIX::UtcTimeStamp::operator=
              ((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture,
               (UtcTimeStamp *)&catchAssertionHandler_79.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_79.m_resultCapture);
    local_39e8 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_39f8,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
               ,0x17f);
    local_3a08 = operator____catch_sr
                           ("TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)"
                            ,0x4c);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_39d8,local_39e8,&local_39f8,local_3a08,ContinueOnFailure);
    bVar1 = FIX::TimeRange::isInSameRange
                      ((UtcTimeOnly *)&endTime_3.super_DateTime.m_time,(UtcTimeOnly *)&endDay_3,4,4,
                       (DateTime *)&time2_2.super_DateTime.m_time,
                       (DateTime *)&catchAssertionHandler_55.m_resultCapture);
    local_3a09 = Catch::operator<=<bool,_0>(&local_3a0a,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_39d8,&local_3a09);
    Catch::AssertionHandler::complete((AssertionHandler *)local_39d8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_39d8);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&catchAssertionHandler_55.m_resultCapture);
    FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&time2_2.super_DateTime.m_time);
    FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&endDay_3);
    FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&endTime_3.super_DateTime.m_time);
  }
  Catch::Section::~Section(&local_27f8);
  return;
}

Assistant:

virtual void signal(int socket) { signaledSocket = socket; }